

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O2

void __thiscall
FrobTadsApplicationCurses::~FrobTadsApplicationCurses(FrobTadsApplicationCurses *this)

{
  (this->super_FrobTadsApplication)._vptr_FrobTadsApplication = (_func_int **)&PTR_init_00341cf0;
  curs_set(0);
  if ((this->super_FrobTadsApplication).options.exitPause == false) {
    FrobTadsWindow::flush
              ((this->fGameWindow)._M_t.
               super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
               super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
               super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl);
  }
  endwin();
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            (&this->fDispBuf);
  std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::~unique_ptr
            (&this->fGameWindow);
  FrobTadsApplication::~FrobTadsApplication(&this->super_FrobTadsApplication);
  return;
}

Assistant:

FrobTadsApplicationCurses::~FrobTadsApplicationCurses()
{
    // Enable the cursor.
    curs_set(0);

    // Flush any pending output so we won't lose any "thanks for
    // playing" messages when "pausing prior to exit" is disabled.
    if (not this->options.exitPause)
        this->fGameWindow->flush();

    // Shut down curses.
    endwin();
}